

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::insert
          (NodeSet *this,int32_t v)

{
  int iVar1;
  int32_t v_00;
  NodeSet *this_00;
  int *piVar2;
  uint n;
  uint __n2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint n_00;
  Vec<int> copy;
  Vec<int> local_60;
  
  this_00 = (NodeSet *)(this->table_).ptr_;
  uVar3 = FindIndex(this_00,(this->table_).size_);
  iVar1 = (this_00->table_).space_[(ulong)uVar3 - 2];
  if (iVar1 == v) goto LAB_002bb8f1;
  if (iVar1 == -1) {
    this->occupied_ = this->occupied_ + 1;
  }
  (this_00->table_).space_[(ulong)uVar3 - 2] = v;
  n_00 = (this->table_).size_;
  if (this->occupied_ < n_00 - (n_00 >> 2)) goto LAB_002bb8f1;
  local_60.ptr_ = local_60.space_;
  local_60.size_ = 0;
  local_60.capacity_ = 8;
  piVar2 = (this->table_).space_;
  if (this_00 == (NodeSet *)piVar2) {
    uVar4 = n_00;
    if (8 < n_00) {
      Vec<int>::Grow(&local_60,n_00);
      uVar4 = (this->table_).size_;
    }
    local_60.size_ = n_00;
    if (uVar4 != 0) {
      memmove(local_60.ptr_,(this->table_).ptr_,(ulong)uVar4 << 2);
      n_00 = local_60.size_;
    }
    (this->table_).size_ = 0;
    uVar4 = (this->table_).capacity_;
  }
  else {
    local_60.capacity_ = (this->table_).capacity_;
    local_60.size_ = n_00;
    (this->table_).ptr_ = piVar2;
    (this->table_).size_ = 0;
    (this->table_).capacity_ = 8;
    uVar4 = 8;
    local_60.ptr_ = (int *)this_00;
  }
  this->occupied_ = 0;
  n = n_00 * 2;
  if (uVar4 < n) {
    Vec<int>::Grow(&this->table_,n);
    (this->table_).size_ = n;
LAB_002bb89e:
    piVar2 = (this->table_).ptr_;
    uVar5 = 0;
    do {
      piVar2[uVar5] = -1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->table_).size_);
    n_00 = local_60.size_;
  }
  else {
    (this->table_).size_ = n;
    if (n != 0) goto LAB_002bb89e;
  }
  piVar2 = local_60.ptr_;
  if (n_00 != 0) {
    lVar6 = 0;
    do {
      v_00 = *(int32_t *)((long)((Vec<int> *)piVar2)->space_ + lVar6 + -8);
      if (-1 < v_00) {
        insert(this,v_00);
      }
      lVar6 = lVar6 + 4;
    } while ((ulong)n_00 << 2 != lVar6);
  }
  Vec<int>::~Vec(&local_60);
LAB_002bb8f1:
  return iVar1 != v;
}

Assistant:

bool insert(int32_t v) {
    uint32_t i = FindIndex(v);
    if (table_[i] == v) {
      return false;
    }
    if (table_[i] == kEmpty) {
      // Only inserting over an empty cell increases the number of occupied
      // slots.
      occupied_++;
    }
    table_[i] = v;
    // Double when 75% full.
    if (occupied_ >= table_.size() - table_.size()/4) Grow();
    return true;
  }